

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.cc
# Opt level: O3

int __thiscall mp::BinaryFormatter::apr(BinaryFormatter *this,File *f,char *fmt,...)

{
  char cVar1;
  byte bVar2;
  FILE *__stream;
  NLUtils *pNVar3;
  char *__s;
  byte *pbVar4;
  char in_AL;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  size_t sVar8;
  long *plVar9;
  void **ppvVar10;
  undefined8 in_RCX;
  ulong uVar11;
  long *plVar12;
  undefined8 in_R8;
  undefined8 in_R9;
  byte *pbVar13;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  U u;
  undefined8 local_158;
  void **local_150;
  void *local_140;
  long *local_138 [2];
  long local_128 [2];
  long *local_118;
  long local_110;
  long local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  BinaryFormatter *local_f8;
  size_t local_f0;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  __stream = (FILE *)f->f_;
  local_150 = &ap[0].overflow_arg_area;
  local_158 = 0x3000000018;
  cVar1 = *fmt;
  iVar5 = 0;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((cVar1 != 0x25) && (fmt = fmt + 1, iVar5 = 0, cVar1 != 'i')) {
    local_140 = (void *)CONCAT71(local_140._1_7_,cVar1);
    fputc((int)cVar1,__stream);
    iVar5 = 1;
  }
  do {
    do {
      iVar6 = iVar5;
      pbVar4 = (byte *)fmt;
      fmt = (char *)(pbVar4 + 1);
      iVar5 = iVar6;
    } while (*pbVar4 == 0x20);
    if (*pbVar4 != 0x25) {
      return iVar6;
    }
    pbVar7 = pbVar4 + 2;
    bVar2 = *fmt;
    if (bVar2 < 0x73) {
      pbVar13 = pbVar7;
      switch(bVar2) {
      case 99:
        uVar11 = local_158 & 0xffffffff;
        if (uVar11 < 0x29) {
          local_158 = CONCAT44(local_158._4_4_,(int)local_158 + 8);
          ppvVar10 = (void **)((long)local_e8 + uVar11);
        }
        else {
          ppvVar10 = local_150;
          local_150 = local_150 + 1;
        }
        local_140 = (void *)CONCAT71(local_140._1_7_,*(undefined1 *)ppvVar10);
        local_f0 = 1;
        break;
      case 100:
switchD_00110319_caseD_64:
        uVar11 = local_158 & 0xffffffff;
        if (uVar11 < 0x29) {
          local_158 = CONCAT44(local_158._4_4_,(int)local_158 + 8);
          ppvVar10 = (void **)((long)local_e8 + uVar11);
        }
        else {
          ppvVar10 = local_150;
          local_150 = local_150 + 1;
        }
        local_140 = (void *)CONCAT44(local_140._4_4_,*(undefined4 *)ppvVar10);
        local_f0 = 4;
        break;
      case 0x67:
switchD_00110319_caseD_67:
        uVar11 = (ulong)local_158._4_4_;
        if (uVar11 < 0xa1) {
          local_158 = CONCAT44(local_158._4_4_ + 0x10,(int)local_158);
          ppvVar10 = (void **)((long)local_e8 + uVar11);
        }
        else {
          ppvVar10 = local_150;
          local_150 = local_150 + 1;
        }
        local_140 = *ppvVar10;
        local_f0 = 8;
        pbVar7 = pbVar13;
        break;
      case 0x68:
        uVar11 = local_158 & 0xffffffff;
        if (uVar11 < 0x29) {
          local_158 = CONCAT44(local_158._4_4_,(int)local_158 + 8);
          ppvVar10 = (void **)((long)local_e8 + uVar11);
        }
        else {
          ppvVar10 = local_150;
          local_150 = local_150 + 1;
        }
        local_140 = (void *)CONCAT62(local_140._2_6_,*(undefined2 *)ppvVar10);
        if (pbVar4[2] == 100) {
          pbVar7 = pbVar4 + 3;
        }
        local_f0 = 2;
        break;
      case 0x6c:
        uVar11 = local_158 & 0xffffffff;
        if (uVar11 < 0x29) {
          local_158 = CONCAT44(local_158._4_4_,(int)local_158 + 8);
          ppvVar10 = (void **)((long)local_e8 + uVar11);
        }
        else {
          ppvVar10 = local_150;
          local_150 = local_150 + 1;
        }
        local_140 = (void *)CONCAT44(local_140._4_4_,*(undefined4 *)ppvVar10);
        if (pbVar4[2] == 100) {
          pbVar7 = pbVar4 + 3;
        }
        local_f0 = 4;
        break;
      default:
        if (bVar2 == 0x2e) {
          do {
            pbVar13 = pbVar7 + 1;
            bVar2 = *pbVar7;
            pbVar7 = pbVar13;
          } while (bVar2 != 0x67);
          goto switchD_00110319_caseD_67;
        }
      case 0x65:
      case 0x66:
      case 0x69:
      case 0x6a:
      case 0x6b:
switchD_00110319_caseD_65:
        pNVar3 = this->utils_;
        local_138[0] = local_128;
        local_f8 = this;
        sVar8 = strlen(fmt);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_138,fmt,(byte *)fmt + sVar8)
        ;
        plVar9 = (long *)std::__cxx11::string::replace((ulong)local_138,0,(char *)0x0,0x11f5d8);
        plVar12 = plVar9 + 2;
        if ((long *)*plVar9 == plVar12) {
          local_108 = *plVar12;
          uStack_100 = (undefined4)plVar9[3];
          uStack_fc = *(undefined4 *)((long)plVar9 + 0x1c);
          local_118 = &local_108;
        }
        else {
          local_108 = *plVar12;
          local_118 = (long *)*plVar9;
        }
        local_110 = plVar9[1];
        *plVar9 = (long)plVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        (*pNVar3->_vptr_NLUtils[7])(pNVar3,&local_118);
        this = local_f8;
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if (local_138[0] != local_128) {
          operator_delete(local_138[0],local_128[0] + 1);
        }
      }
      fwrite(&local_140,local_f0,1,__stream);
    }
    else {
      if (bVar2 != 0x73) {
        if (bVar2 != 0x7a) goto switchD_00110319_caseD_65;
        goto switchD_00110319_caseD_64;
      }
      uVar11 = local_158 & 0xffffffff;
      if (uVar11 < 0x29) {
        local_158 = CONCAT44(local_158._4_4_,(int)local_158 + 8);
        ppvVar10 = (void **)((long)local_e8 + uVar11);
      }
      else {
        ppvVar10 = local_150;
        local_150 = local_150 + 1;
      }
      __s = (char *)*ppvVar10;
      sVar8 = strlen(__s);
      local_140 = (void *)CONCAT44(local_140._4_4_,(int)sVar8);
      fwrite(&local_140,4,1,__stream);
      fwrite(__s,(long)(int)local_140,1,__stream);
    }
    fmt = (char *)pbVar7;
    iVar5 = iVar6 + 1;
    if (*pbVar7 == 0x3a) {
      uVar11 = local_158 & 0xffffffff;
      if (uVar11 < 0x29) {
        local_158 = CONCAT44(local_158._4_4_,(int)local_158 + 8);
        ppvVar10 = (void **)((long)local_e8 + uVar11);
      }
      else {
        ppvVar10 = local_150;
        local_150 = local_150 + 1;
      }
      fwrite(*ppvVar10,(long)(int)local_140,1,__stream);
      fmt = (char *)(pbVar7 + 3);
      iVar5 = iVar6 + 2;
    }
  } while( true );
}

Assistant:

int BinaryFormatter::
apr(File& f, const char *fmt, ...)
{
  auto fd = f.GetHandle();
  U u;
  char *s;
  int i, rc;
  size_t len, x;
  va_list ap;

  rc = 0;
  va_start(ap, fmt);

  if ((i = *fmt) != '%') {
    fmt++;
#define DMG
#ifdef DMG
    if (i != 'i')
#endif
    {
      u.c = i;
      fwrite(&u.c, 1, 1, fd);
      rc++;
    }}

  for(;;) {
    while(*fmt == ' ')
      fmt++;
    if (*fmt++ != '%')
      break;
    switch(*fmt++) {
    case 'c':
      u.c = va_arg(ap, int);
      len = 1;
      break;
    case 'd':
      u.i = va_arg(ap, int);
      len = sizeof(Int);
      break;
    case '.':
      while(*fmt++ != 'g');
    case 'g':
      u.x = va_arg(ap, double);
      len = sizeof(double);
      break;
    case 'h':
      u.sh = va_arg(ap, int);
      len = sizeof(short);
      if (*fmt == 'd')
        fmt++;
      break;
    case 'l':
      u.L = (Long)va_arg(ap, long);
      len = sizeof(Long);
      if (*fmt == 'd')
        fmt++;
      break;
    case 's':
      s = va_arg(ap, char*);
      u.i = std::strlen(s);
      fwrite((char *)&u.i, sizeof(Int), 1, fd);
      fwrite(s, u.i, 1, fd);
      goto s_written;
    case 'z':
      x = va_arg(ap, size_t);
      u.L = (Long)x;
      len = sizeof(Long);
      break;
    default:
      Utils().myexit("bprintf bug: unexpected fmt: " +
                     std::string(fmt-1));
#ifdef AVOID_BOGUS_WARNINGS
      len = 0;
#endif
    }
    fwrite((char *)&u.L, len, 1, fd);
s_written:
    rc++;
    if (*fmt == ':') {
      /* special Hollerith */
      s = va_arg(ap, char*);
      fwrite(s, u.i, 1, fd);
      fmt += 3;
      rc++;
    }
  }
  va_end(ap);
  return rc;
}